

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O1

void __thiscall
rest_rpc::rpc_service::connection::publish(connection *this,string *key,string *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string result;
  string local_58;
  string local_38;
  
  msgpack_codec::
  pack_args_str<rest_rpc::result_code,std::__cxx11::string_const&,std::__cxx11::string_const&,void>
            (&local_58,(msgpack_codec *)0x0,(result_code)key,data,in_R8);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar1) {
    local_38.field_2._8_8_ = local_58.field_2._8_8_;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  local_38._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  response(this,0,&local_38,sub_pub);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void publish(const std::string &key, const std::string &data) {
    auto result = msgpack_codec::pack_args_str(result_code::OK, key, data);
    response(0, std::move(result), request_type::sub_pub);
  }